

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_remove_backend_servers.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4f68b::Json2Array<aliyun::SlbRemoveBackendServersBackendServerType>::Json2Array
          (Json2Array<aliyun::SlbRemoveBackendServersBackendServerType> *this,Value *value,
          vector<aliyun::SlbRemoveBackendServersBackendServerType,_std::allocator<aliyun::SlbRemoveBackendServersBackendServerType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_50 [8];
  SlbRemoveBackendServersBackendServerType val;
  int i;
  vector<aliyun::SlbRemoveBackendServersBackendServerType,_std::allocator<aliyun::SlbRemoveBackendServersBackendServerType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::SlbRemoveBackendServersBackendServerType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val._36_4_ = 0; uVar1 = val._36_4_, AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val._36_4_ = val._36_4_ + 1) {
      aliyun::SlbRemoveBackendServersBackendServerType::SlbRemoveBackendServersBackendServerType
                ((SlbRemoveBackendServersBackendServerType *)local_50);
      value_00 = Json::Value::operator[](value,val._36_4_);
      anon_unknown.dwarf_4f68b::Json2Type
                (value_00,(SlbRemoveBackendServersBackendServerType *)local_50);
      std::
      vector<aliyun::SlbRemoveBackendServersBackendServerType,_std::allocator<aliyun::SlbRemoveBackendServersBackendServerType>_>
      ::push_back(vec,(value_type *)local_50);
      aliyun::SlbRemoveBackendServersBackendServerType::~SlbRemoveBackendServersBackendServerType
                ((SlbRemoveBackendServersBackendServerType *)local_50);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }